

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdNonDsdSizeMax(Kit_DsdNtk_t *pNtk)

{
  Kit_DsdObj_t KVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((ulong)pNtk->nNodes == 0) {
    return 0;
  }
  uVar3 = 0;
  uVar2 = 0;
  do {
    if (pNtk->pNodes[uVar3] == (Kit_DsdObj_t *)0x0) {
      return uVar2;
    }
    KVar1 = *pNtk->pNodes[uVar3];
    uVar4 = (uint)KVar1 >> 0x1a;
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    if (((uint)KVar1 & 0x1c0) == 0x140) {
      uVar2 = uVar4;
    }
    uVar3 = uVar3 + 1;
  } while (pNtk->nNodes != uVar3);
  return uVar2;
}

Assistant:

int Kit_DsdNonDsdSizeMax( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i, nSizeMax = 0;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        if ( nSizeMax < pObj->nFans )
            nSizeMax = pObj->nFans;
    }
    return nSizeMax;
}